

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::parse_check(parser *this,int argc,char **argv)

{
  ulong uVar1;
  undefined8 uVar2;
  size_type sVar3;
  undefined8 in_RDX;
  undefined4 in_ESI;
  allocator<char> *in_RDI;
  char **in_stack_00000458;
  int in_stack_00000464;
  parser *in_stack_00000468;
  key_type *in_stack_ffffffffffffff28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffff30;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff77;
  string *in_stack_ffffffffffffff78;
  parser *in_stack_ffffffffffffff80;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [35];
  undefined4 in_stack_fffffffffffffff0;
  
  __s = &local_39;
  unique0x1000027c = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff60,(char *)__s,in_RDI);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff60,(char *)__s,in_RDI)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff60,(char *)__s,in_RDI)
    ;
    add(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77,
        in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  parse(in_stack_00000468,in_stack_00000464,in_stack_00000458);
  uVar2 = stack0xffffffffffffffe8;
  uVar1 = (ulong)stack0xffffffffffffffe8 >> 0x20;
  check((parser *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)uVar1,
        SUB81((ulong)uVar2 >> 0x18,0));
  return;
}

Assistant:

void parse_check(int argc, char* argv[]) {
        if (!options.count("help")) add("help", '?', "print this message");
        check(argc, parse(argc, argv));
    }